

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgram.cpp
# Opt level: O2

int __thiscall zmq::dgram_t::xsend(dgram_t *this,msg_t *msg_)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  char *errmsg_;
  size_t in_RCX;
  void *__buf;
  int iVar6;
  EVP_PKEY_CTX *ctx;
  undefined8 uVar7;
  
  if (this->_pipe == (pipe_t *)0x0) {
    iVar3 = msg_t::close(msg_,(int)msg_);
    iVar6 = -1;
    if (iVar3 == 0) {
      return -1;
    }
    piVar4 = __errno_location();
    errmsg_ = strerror(*piVar4);
    uVar7 = 0x62;
  }
  else {
    bVar1 = this->_more_out;
    bVar2 = msg_t::flags(msg_);
    if (bVar1 == false) {
      if ((bVar2 & 1) == 0) goto LAB_00172317;
    }
    else if ((bVar2 & 1) != 0) {
LAB_00172317:
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      return -1;
    }
    ctx = (EVP_PKEY_CTX *)msg_;
    sVar5 = pipe_t::write(this->_pipe,(int)msg_,__buf,in_RCX);
    if ((char)sVar5 == '\0') {
      piVar4 = __errno_location();
      *piVar4 = 0xb;
      return -1;
    }
    bVar2 = msg_t::flags(msg_);
    if ((bVar2 & 1) == 0) {
      pipe_t::flush(this->_pipe);
    }
    this->_more_out = (bool)(this->_more_out ^ 1);
    iVar3 = msg_t::init(msg_,ctx);
    if (iVar3 == 0) {
      return 0;
    }
    piVar4 = __errno_location();
    errmsg_ = strerror(*piVar4);
    iVar6 = 0;
    uVar7 = 0x83;
  }
  fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dgram.cpp"
          ,uVar7);
  fflush(_stderr);
  zmq_abort(errmsg_);
  return iVar6;
}

Assistant:

int zmq::dgram_t::xsend (msg_t *msg_)
{
    // If there's no out pipe, just drop it.
    if (!_pipe) {
        const int rc = msg_->close ();
        errno_assert (rc == 0);
        return -1;
    }

    //  If this is the first part of the message it's the ID of the
    //  peer to send the message to.
    if (!_more_out) {
        if (!(msg_->flags () & msg_t::more)) {
            errno = EINVAL;
            return -1;
        }
    } else {
        //  dgram messages are two part only, reject part if more is set
        if (msg_->flags () & msg_t::more) {
            errno = EINVAL;
            return -1;
        }
    }

    // Push the message into the pipe.
    if (!_pipe->write (msg_)) {
        errno = EAGAIN;
        return -1;
    }

    if (!(msg_->flags () & msg_t::more))
        _pipe->flush ();

    // flip the more flag
    _more_out = !_more_out;

    //  Detach the message from the data buffer.
    const int rc = msg_->init ();
    errno_assert (rc == 0);

    return 0;
}